

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void writeSamples(FILE *outFile,vector<float_*,_std::allocator<float_*>_> *outChannelBufs,
                 int channels,int samples,int bytesPerSample)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  int iVar3;
  int c;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 *puVar13;
  
  iVar1 = samples * channels * bytesPerSample;
  uVar9 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar9 = (long)iVar1;
  }
  __ptr = operator_new__(uVar9);
  iVar3 = 0x80 << ((char)bytesPerSample * '\b' - 8U & 0x1f);
  iVar7 = 2 - iVar3;
  iVar3 = iVar3 + -2;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < bytesPerSample) {
    uVar10 = (ulong)(uint)bytesPerSample;
  }
  uVar11 = 0;
  if (0 < channels) {
    uVar11 = (ulong)(uint)channels;
  }
  uVar4 = (ulong)(uint)samples;
  if (samples < 1) {
    uVar4 = uVar9;
  }
  for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
    iVar8 = (int)uVar9;
    for (uVar5 = 0; uVar5 != uVar11; uVar5 = uVar5 + 1) {
      iVar6 = (int)(outChannelBufs->super__Vector_base<float_*,_std::allocator<float_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5][uVar12];
      puVar13 = (undefined1 *)((long)(int)uVar9 + (long)__ptr);
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar3 < iVar6) {
        iVar6 = iVar3;
      }
      for (lVar2 = 0; uVar10 * 8 != lVar2; lVar2 = lVar2 + 8) {
        *puVar13 = (char)(iVar6 >> ((byte)lVar2 & 0x1f));
        puVar13 = puVar13 + 1;
      }
      uVar9 = (ulong)(uint)((int)uVar9 + bytesPerSample);
    }
    uVar9 = (ulong)(uint)(iVar8 + channels * bytesPerSample);
  }
  fwrite(__ptr,1,(long)iVar1,(FILE *)outFile);
  return;
}

Assistant:

void writeSamples(FILE* outFile, std::vector<float*> outChannelBufs, int channels, int samples, int bytesPerSample){
	int ioBlockSize = channels * samples * bytesPerSample;
	uint8_t *outBufInterleaved = new uint8_t[ioBlockSize];
	int32_t maxAbsSampleVal = (0x80 << ((bytesPerSample - 1) * 8)) - 2;
	for(int i = 0; i < samples; i++){
		for(int c = 0; c < channels; c++){
			int32_t sample = (int32_t) outChannelBufs[c][i];
			sample = std::min(std::max(sample, -maxAbsSampleVal), maxAbsSampleVal);
			for(int b = 0; b < bytesPerSample; b++){
				outBufInterleaved[i * channels * bytesPerSample + c * bytesPerSample + b] = (sample >> (8 * b)) & 0xff;
			}
		}
	}
	fwrite(outBufInterleaved, 1, ioBlockSize, outFile);
}